

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

character_controller_ptr __thiscall
APhyBullet::BulletEngine::createKinematicCharacterController
          (BulletEngine *this,collision_object_ref *ghost_object,collision_shape_ref *convex_shape,
          aphy_scalar step_height,aphy_axis up_axis)

{
  character_controller *pcVar1;
  btKinematicCharacterController *this_00;
  int upAxis;
  ref<aphy::character_controller> rVar2;
  ref<aphy::character_controller> result;
  ref<aphy::character_controller> local_30;
  
  if (ghost_object->counter == (Counter *)0x0) {
    rVar2.counter = (character_controller_ptr)0x0;
  }
  else {
    rVar2.counter = (character_controller_ptr)0x0;
    if ((*(int *)&ghost_object->counter->object[2].super_base_interface.myRefCounter == 2) &&
       (convex_shape->counter != (Counter *)0x0)) {
      this_00 = (btKinematicCharacterController *)btKinematicCharacterController::operator_new(0xf8)
      ;
      upAxis = (up_axis != APHY_AXIS_Y) + 1;
      if (up_axis == APHY_AXIS_X) {
        upAxis = 0;
      }
      btKinematicCharacterController::btKinematicCharacterController
                (this_00,(btPairCachingGhostObject *)
                         ghost_object->counter->object[1].super_base_interface._vptr_base_interface,
                 (btConvexShape *)
                 convex_shape->counter->object[1].super_base_interface._vptr_base_interface,
                 step_height,upAxis);
      aphy::
      makeObjectWithInterface<aphy::character_controller,APhyBullet::BulletCharacterController,btKinematicCharacterController*>
                ((aphy *)&local_30,this_00);
      pcVar1 = (local_30.counter)->object;
      aphy::ref<aphy::collision_object>::operator=
                ((ref<aphy::collision_object> *)&pcVar1[1].super_base_interface.myRefCounter,
                 ghost_object);
      aphy::ref<aphy::collision_shape>::operator=
                ((ref<aphy::collision_shape> *)(pcVar1 + 2),convex_shape);
      rVar2.counter = local_30.counter;
      local_30.counter = (Counter *)0x0;
      aphy::ref<aphy::character_controller>::~ref(&local_30);
    }
  }
  return rVar2.counter;
}

Assistant:

collision_shape_ptr BulletEngine::createConeX(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShapeX(radius, height)
    ).disown();
}